

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

char * cppcms_capi_session_get(cppcms_capi_session *session,char *key)

{
  session_interface *psVar1;
  bool bVar2;
  allocator local_69;
  string local_68;
  string local_48;
  
  if (session != (cppcms_capi_session *)0x0) {
    anon_unknown.dwarf_418ba7::check_str(key);
    cppcms_capi_session::check_loaded(session);
    psVar1 = (session->p).ptr_;
    std::__cxx11::string::string((string *)&local_68,key,(allocator *)&local_48);
    bVar2 = cppcms::session_interface::is_set(psVar1,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (bVar2) {
      psVar1 = (session->p).ptr_;
      std::__cxx11::string::string((string *)&local_48,key,&local_69);
      cppcms::session_interface::get(&local_68,psVar1,&local_48);
      std::__cxx11::string::operator=((string *)&session->returned_value,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      return (session->returned_value)._M_dataplus._M_p;
    }
  }
  return (char *)0x0;
}

Assistant:

char const *cppcms_capi_session_get(cppcms_capi_session *session,char const *key)
{
	TRY {
		if(!session)
			return 0;
		check_str(key);
		session->check_loaded();
		if(!session->p->is_set(key))
			return 0;
		session->returned_value = session->p->get(key);
		return session->returned_value.c_str();
	}